

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::LastIndexOfHelper<Js::TypedArrayBase>
              (TypedArrayBase *pArr,Var search,int64 fromIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint64 uVar5;
  uint64 uVar6;
  Var aLeft;
  ulong uVar7;
  uint index;
  ulong uVar8;
  uint32 i;
  uint uVar9;
  Var index_00;
  Var local_50;
  Var element;
  undefined4 *local_40;
  ScriptContext *local_38;
  
  local_50 = (Var)0x0;
  uVar7 = (ulong)search & 0xffff000000000000;
  element = search;
  local_38 = scriptContext;
  if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 && uVar7 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b8bce8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (fromIndex < 0xffffffff) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      local_40 = (undefined4 *)(double)fromIndex;
      uVar5 = NumberUtilities::ToSpecial((double)local_40);
      bVar2 = NumberUtilities::IsNan((double)local_40);
      if (((bVar2) &&
          (uVar6 = NumberUtilities::ToSpecial((double)local_40), uVar6 != 0xfff8000000000000)) &&
         (uVar6 = NumberUtilities::ToSpecial((double)local_40), uVar6 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00b8bce8;
        *puVar4 = 0;
      }
      index_00 = (Var)(uVar5 ^ 0xfffc000000000000);
      BVar3 = JavascriptOperators::OP_HasItem(pArr,index_00,local_38);
      if (BVar3 != 0) {
        aLeft = JavascriptOperators::OP_GetElementI(pArr,index_00,local_38);
        local_50 = aLeft;
        if (uVar7 == 0x1000000000000) {
          if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00b8bad5;
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar2) goto LAB_00b8bce8;
            *puVar4 = 0;
          }
          if (aLeft == element) {
            return index_00;
          }
        }
        else {
LAB_00b8bad5:
          BVar3 = JavascriptOperators::StrictEqual(aLeft,element,local_38);
          if (BVar3 != 0) {
            return index_00;
          }
        }
      }
      bVar2 = 0xffffffff < fromIndex;
      fromIndex = fromIndex + -1;
    } while (bVar2);
    fromIndex = 0xfffffffe;
    local_40 = puVar4;
  }
  uVar9 = 0;
  uVar8 = fromIndex & 0xffffffff;
  do {
    index = (uint)uVar8;
    BVar3 = TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
                      ((RecyclableObject *)pArr,index,&local_50,local_38,true);
    if (BVar3 != 0) {
      if (uVar7 == 0x1000000000000) {
        if (((ulong)local_50 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)local_50 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)local_50 & 0xffff000000000000) != 0x1000000000000) goto LAB_00b8bbfb;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = local_40;
          *local_40 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00b8bce8;
          *puVar4 = 0;
        }
        if (local_50 == element) {
LAB_00b8bc20:
          if (-1 < (int)index) {
            return (Var)(uVar8 | 0x1000000000000);
          }
          local_38 = (ScriptContext *)(double)uVar8;
          uVar5 = NumberUtilities::ToSpecial((double)local_38);
          bVar2 = NumberUtilities::IsNan((double)local_38);
          if (((bVar2) &&
              (uVar6 = NumberUtilities::ToSpecial((double)local_38), uVar6 != 0xfff8000000000000))
             && (uVar6 = NumberUtilities::ToSpecial((double)local_38), uVar6 != 0x7ff8000000000000))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = local_40;
            *local_40 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar2) goto LAB_00b8bce8;
            *puVar4 = 0;
          }
          return (Var)(uVar5 ^ 0xfffc000000000000);
        }
      }
      else {
LAB_00b8bbfb:
        BVar3 = JavascriptOperators::StrictEqual(local_50,element,local_38);
        if (BVar3 != 0) goto LAB_00b8bc20;
      }
    }
    uVar9 = uVar9 + 1;
    uVar8 = (ulong)(index - 1);
    if ((uint)fromIndex < uVar9) {
      return &DAT_10000ffffffff;
    }
  } while( true );
}

Assistant:

Var JavascriptArray::LastIndexOfHelper(T* pArr, Var search, int64 fromIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);

        // First handle the indices > 2^32
        while (fromIndex >= MaxArrayLength)
        {
            Var index = JavascriptNumber::ToVar(fromIndex, scriptContext);

            if (JavascriptOperators::OP_HasItem(pArr, index, scriptContext))
            {
                element = JavascriptOperators::OP_GetElementI(pArr, index, scriptContext);

                if (isSearchTaggedInt && TaggedInt::Is(element))
                {
                    if (element == search)
                    {
                        return index;
                    }
                    fromIndex--;
                    continue;
                }

                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return index;
                }
            }

            fromIndex--;
        }

        Assert(fromIndex < MaxArrayLength);

        // fromIndex now has to be < MaxArrayLength so casting to uint32 is safe
        uint32 end = static_cast<uint32>(fromIndex);

        for (uint32 i = 0; i <= end; i++)
        {
            uint32 index = end - i;

            if (!TryTemplatedGetItem<T>(pArr, index, &element, scriptContext))
            {
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return JavascriptNumber::ToVar(index, scriptContext);
                }
                continue;
            }

            if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                return JavascriptNumber::ToVar(index, scriptContext);
            }
        }

        return TaggedInt::ToVarUnchecked(-1);
    }